

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

type __thiscall
chrono::ChValueSpecific<double[3]>::_get_name_string<double[3]>(ChValueSpecific<double[3]> *this)

{
  int iVar1;
  
  if (_get_name_string<double[3]>()::nostring_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&_get_name_string<double[3]>()::nostring_abi_cxx11_);
    if (iVar1 != 0) {
      _get_name_string<double[3]>()::nostring_abi_cxx11_._M_dataplus._M_p =
           (pointer)&_get_name_string<double[3]>()::nostring_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&_get_name_string<double[3]>()::nostring_abi_cxx11_,"");
      __cxa_atexit(std::__cxx11::string::~string,&_get_name_string<double[3]>()::nostring_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&_get_name_string<double[3]>()::nostring_abi_cxx11_);
    }
  }
  return &_get_name_string<double[3]>()::nostring_abi_cxx11_;
}

Assistant:

typename enable_if< !ChDetect_ArchiveContainerName<Tc>::value, std::string& >::type 
        _get_name_string() {
            static std::string nostring(""); 
            return nostring; // nothing to do if not provided
        }